

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdSocket.cpp
# Opt level: O1

size_t __thiscall UdpSocketImpl::Read(UdpSocketImpl *this,void *buf,size_t len,string *strFrom)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  mutex *__mutex;
  _Elt_pointer ptVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  unsigned_long __n;
  int iVar4;
  unsigned_long __n_00;
  uchar *__s;
  unsigned_long __n2;
  unsigned_long __n2_1;
  ulong __n_01;
  __array tmp;
  DATA data;
  size_t nRest;
  _Head_base<0UL,_unsigned_char_*,_false> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  unsigned_long local_48;
  _Head_base<0UL,_unsigned_char_*,_false> local_40;
  ulong local_38;
  
  __n_00 = 0;
  if (((len != 0) && (buf != (void *)0x0)) &&
     ((this->m_atInBytes).super___atomic_base<unsigned_long>._M_i != 0)) {
    __mutex = &this->m_mxInDeque;
    iVar4 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
    if (iVar4 != 0) {
      std::__throw_system_error(iVar4);
    }
    ptVar2 = (this->m_quInData).
             super__Deque_base<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    paVar3 = *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               **)&(ptVar2->
                   super__Tuple_impl<0UL,_std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ).
                   super__Tuple_impl<1UL,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   .
                   super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   .
                   super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                   ._M_head_impl._M_dataplus;
    paVar1 = &(ptVar2->
              super__Tuple_impl<0UL,_std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ).
              super__Tuple_impl<1UL,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .
              super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              .
              super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
              ._M_head_impl.field_2;
    if (paVar3 == paVar1) {
      local_68.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
      local_68.field_2._8_8_ =
           *(undefined8 *)
            ((long)&(ptVar2->
                    super__Tuple_impl<0UL,_std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ).
                    super__Tuple_impl<1UL,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .
                    super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    .
                    super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                    ._M_head_impl.field_2 + 8);
    }
    else {
      local_68.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
      local_68._M_dataplus._M_p = (pointer)paVar3;
    }
    local_68._M_string_length =
         (ptVar2->
         super__Tuple_impl<0UL,_std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ).
         super__Tuple_impl<1UL,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .
         super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         .
         super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
         ._M_head_impl._M_string_length;
    (ptVar2->
    super__Tuple_impl<0UL,_std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ).
    super__Tuple_impl<1UL,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
    ._M_head_impl._M_dataplus = (_Alloc_hider)paVar1;
    (ptVar2->
    super__Tuple_impl<0UL,_std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ).
    super__Tuple_impl<1UL,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
    ._M_head_impl._M_string_length = 0;
    (ptVar2->
    super__Tuple_impl<0UL,_std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ).
    super__Tuple_impl<1UL,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Tuple_impl<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    .
    super__Head_base<2UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
    ._M_head_impl.field_2._M_local_buf[0] = '\0';
    local_48 = (ptVar2->
               super__Tuple_impl<0UL,_std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ).
               super__Tuple_impl<1UL,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               .super__Head_base<1UL,_unsigned_long,_false>._M_head_impl;
    local_40._M_head_impl =
         (ptVar2->
         super__Tuple_impl<0UL,_std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         ).
         super__Head_base<0UL,_std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_false>
         ._M_head_impl._M_t.
         super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
         super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
         super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
    (ptVar2->
    super__Tuple_impl<0UL,_std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ).
    super__Head_base<0UL,_std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_false>
    ._M_head_impl._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
    _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
    super__Head_base<0UL,_unsigned_char_*,_false> = (_Head_base<0UL,_unsigned_char_*,_false>)0x0;
    std::
    deque<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::pop_front(&this->m_quInData);
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    __n_00 = len;
    if (local_48 < len) {
      __n_00 = local_48;
    }
    if (__n_00 != 0) {
      memmove(buf,local_40._M_head_impl,__n_00);
    }
    LOCK();
    (this->m_atInBytes).super___atomic_base<unsigned_long>._M_i =
         (this->m_atInBytes).super___atomic_base<unsigned_long>._M_i - __n_00;
    UNLOCK();
    std::__cxx11::string::_M_assign((string *)strFrom);
    __n = local_48;
    __n_01 = local_48 - __n_00;
    if (__n_00 <= local_48 && __n_01 != 0) {
      local_38 = __n_01;
      __s = (uchar *)operator_new__(__n_01);
      memset(__s,0,__n_01);
      local_70._M_head_impl = __s;
      memmove(__s,local_40._M_head_impl + __n_00,__n);
      iVar4 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
      if (iVar4 != 0) {
        std::__throw_system_error(iVar4);
      }
      std::
      deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>>>
      ::
      emplace_front<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long&,std::__cxx11::string&>
                ((deque<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>,std::allocator<std::tuple<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,unsigned_long,std::__cxx11::string>>>
                  *)&this->m_quInData,
                 (unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)&local_70,
                 &local_38,&local_68);
      pthread_mutex_unlock((pthread_mutex_t *)__mutex);
      if (local_70._M_head_impl != (uchar *)0x0) {
        operator_delete__(local_70._M_head_impl);
      }
    }
    if (local_40._M_head_impl != (uchar *)0x0) {
      operator_delete__(local_40._M_head_impl);
    }
    local_40._M_head_impl = (uchar *)0x0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
  }
  return __n_00;
}

Assistant:

size_t UdpSocketImpl::Read(void* buf, size_t len, string& strFrom)
{
    if (m_atInBytes == 0 || buf == nullptr || len == 0)
        return 0;

    size_t nOffset = 0;
    size_t nRet = 0;

    m_mxInDeque.lock();
    DATA data = move(m_quInData.front());
    m_quInData.pop_front();
    m_mxInDeque.unlock();

    // Copy the data into the destination buffer
    const size_t nToCopy = min(BUFLEN(data), len);
    copy_n(&BUFFER(data)[0], nToCopy, &static_cast<uint8_t*>(buf)[nOffset]);
    m_atInBytes -= nToCopy;
    strFrom = ADDRESS(data);
    nRet += nToCopy;

    if (nToCopy < BUFLEN(data))
    {   // Put the Rest of the Data back to the Que
        size_t nRest = BUFLEN(data) - nToCopy;
        auto tmp = make_unique<uint8_t[]>(nRest);
        copy_n(&BUFFER(data)[nToCopy], nToCopy + nRest, &tmp[0]);
        m_mxInDeque.lock();
        m_quInData.emplace_front(move(tmp), nRest, ADDRESS(data));
        m_mxInDeque.unlock();
    }

    return nRet;
}